

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O3

Error llvm::
      handleErrorImpl<llvm::DWARFDebugNames::NameIndex::dumpEntry(llvm::ScopedPrinter&,unsigned_long*)const::__0,llvm::DWARFDebugNames::NameIndex::dumpEntry(llvm::ScopedPrinter&,unsigned_long*)const::__1>
                (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload
                ,anon_class_1_0_00000001 *Handler,anon_class_8_1_54a397f7 *Handlers)

{
  long *plVar1;
  ScopedPrinter *this;
  char cVar2;
  Error EVar3;
  char *__function;
  
  cVar2 = (**(code **)(**(long **)Handler + 0x30))
                    (*(long **)Handler,&DWARFDebugNames::SentinelError::ID);
  plVar1 = *(long **)Handler;
  *(undefined8 *)Handler = 0;
  if (cVar2 == '\0') {
    EVar3.Payload = (ErrorInfoBase *)(**(code **)(*plVar1 + 0x30))(plVar1,&ErrorInfoBase::ID);
    if ((char)EVar3.Payload == '\0') {
      (Payload->_M_t).
      super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
      super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
      super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
           (ErrorInfoBase *)((ulong)plVar1 | 1);
      return (Error)EVar3.Payload;
    }
    cVar2 = (**(code **)(*plVar1 + 0x30))(plVar1,&ErrorInfoBase::ID);
    if (cVar2 != '\0') {
      this = Handlers->W;
      ScopedPrinter::printIndent(this);
      (**(code **)(*plVar1 + 0x10))(plVar1,this->OS);
      goto LAB_00ad87dc;
    }
    __function = 
    "static Error llvm::ErrorHandlerTraits<void (&)(llvm::ErrorInfoBase &)>::apply(HandlerT &&, std::unique_ptr<ErrorInfoBase>) [HandlerT = void (&)(llvm::ErrorInfoBase &), HandlerT = (lambda at /workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFAcceleratorTable.cpp:661:21)]"
    ;
  }
  else {
    cVar2 = (**(code **)(*plVar1 + 0x30))(plVar1,&DWARFDebugNames::SentinelError::ID);
    if (cVar2 != '\0') {
LAB_00ad87dc:
      (Payload->_M_t).
      super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
      super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
      super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl = (ErrorInfoBase *)0x1;
      EVar3.Payload = (ErrorInfoBase *)(**(code **)(*plVar1 + 8))(plVar1);
      return (Error)EVar3.Payload;
    }
    __function = 
    "static Error llvm::ErrorHandlerTraits<void (&)(llvm::DWARFDebugNames::SentinelError &)>::apply(HandlerT &&, std::unique_ptr<ErrorInfoBase>) [HandlerT = void (&)(llvm::DWARFDebugNames::SentinelError &), HandlerT = (lambda at /workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFAcceleratorTable.cpp:660:42)]"
    ;
  }
  __assert_fail("appliesTo(*E) && \"Applying incorrect handler\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/Error.h"
                ,0x329,__function);
}

Assistant:

Error handleErrorImpl(std::unique_ptr<ErrorInfoBase> Payload,
                      HandlerT &&Handler, HandlerTs &&... Handlers) {
  if (ErrorHandlerTraits<HandlerT>::appliesTo(*Payload))
    return ErrorHandlerTraits<HandlerT>::apply(std::forward<HandlerT>(Handler),
                                               std::move(Payload));
  return handleErrorImpl(std::move(Payload),
                         std::forward<HandlerTs>(Handlers)...);
}